

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_EndpointUrl_split_ptr(char *endpointUrl,char *hostname,char **port,char **path)

{
  char cVar1;
  UA_StatusCode UVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  UVar2 = 0x80ab0000;
  if (hostname != (char *)0x0 && endpointUrl != (char *)0x0) {
    sVar4 = strlen(endpointUrl);
    UVar2 = 0x803c0000;
    if (0xffffffffffffff09 < sVar4 - 0x100) {
      iVar3 = strncmp(endpointUrl,"opc.tcp://",10);
      UVar2 = 0x80350000;
      if (iVar3 == 0) {
        if (sVar4 == 10) {
          *path = (char *)0x0;
          *hostname = '\0';
          uVar7 = 10;
        }
        else {
          bVar9 = endpointUrl[10] != '[';
          bVar8 = true;
          uVar7 = 10;
          do {
            uVar6 = uVar7;
            cVar1 = endpointUrl[uVar6];
            if (bVar9) {
              if ((cVar1 == '/') || (bVar9 = true, cVar1 == ':')) break;
            }
            else {
              bVar9 = cVar1 == ']';
            }
            uVar7 = uVar6 + 1;
            bVar8 = uVar7 < sVar4;
            uVar6 = sVar4;
          } while (uVar7 != sVar4);
          uVar7 = 10;
          if (bVar8) {
            uVar7 = uVar6;
          }
          memcpy(hostname,endpointUrl + 10,uVar6 - 10);
          hostname[uVar6 - 10] = '\0';
          if (port != (char **)0x0) {
            if (uVar6 < sVar4 - 1) {
              pcVar5 = (char *)0x0;
              if (endpointUrl[uVar6] != '/') {
                pcVar5 = endpointUrl + uVar6 + 1;
              }
            }
            else {
              pcVar5 = (char *)0x0;
            }
            *port = pcVar5;
          }
          if (path == (char **)0x0) {
            return 0;
          }
        }
        uVar6 = uVar7;
        if (uVar7 < sVar4) {
          do {
            uVar6 = uVar7;
            if (endpointUrl[uVar7] == '/') break;
            uVar7 = uVar7 + 1;
            uVar6 = sVar4;
          } while (sVar4 != uVar7);
        }
        UVar2 = 0;
        pcVar5 = endpointUrl + uVar6 + 1;
        if (sVar4 - 1 <= uVar6) {
          pcVar5 = (char *)0x0;
        }
        *path = pcVar5;
      }
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split_ptr(const char *endpointUrl, char *hostname,
                         const char ** port, const char **path) {
    if (!endpointUrl || !hostname)
        return UA_STATUSCODE_BADINVALIDARGUMENT;

    size_t urlLength = strlen(endpointUrl);
    if(urlLength < 10 || urlLength >= 256)
        return UA_STATUSCODE_BADOUTOFRANGE;

    if(strncmp(endpointUrl, "opc.tcp://", 10) != 0)
        return UA_STATUSCODE_BADATTRIBUTEIDINVALID;

    if (urlLength == 10) {
        hostname[0] = '\0';
        port = NULL;
        *path = NULL;
    }

    /* where does the port begin? */
    size_t portpos = 10;
    // opc.tcp://[2001:0db8:85a3::8a2e:0370:7334]:1234/path
    // if ip6, then end not found, otherwise we are fine
    UA_Boolean ip6_end_found = endpointUrl[portpos] != '[';
    for(; portpos < urlLength; ++portpos) {
        if (!ip6_end_found) {
            if (endpointUrl[portpos] == ']')
                ip6_end_found = UA_TRUE;
            continue;
        }

        if(endpointUrl[portpos] == ':' || endpointUrl[portpos] == '/')
            break;
    }

    memcpy(hostname, &endpointUrl[10], portpos - 10);
    hostname[portpos-10] = 0;

    if(port) {
        if (portpos < urlLength - 1) {
            if (endpointUrl[portpos] == '/')
                *port = NULL;
            else
                *port = &endpointUrl[portpos + 1];
        } else {
            *port = NULL;
        }
    }

    if(path) {
        size_t pathpos = portpos < urlLength ? portpos : 10;
        for(; pathpos < urlLength; ++pathpos) {
            if(endpointUrl[pathpos] == '/')
                break;
        }
        if (pathpos < urlLength-1)
            *path = &endpointUrl[pathpos+1]; // do not include slash in path
        else
            *path = NULL;
    }

    return UA_STATUSCODE_GOOD;
}